

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O1

void Pdr_ManDeriveResult(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vCi2Rem,
                        Vec_Int_t *vRes,Vec_Int_t *vPiLits)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *p;
  int iVar3;
  int *piVar4;
  long lVar5;
  int *piVar6;
  
  Aig_ManIncrementTravId(pAig);
  iVar3 = vCi2Rem->nSize;
  if (0 < (long)iVar3) {
    piVar4 = vCi2Rem->pArray;
    pVVar2 = pAig->vObjs;
    lVar5 = 0;
    do {
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        piVar6 = (int *)0x0;
      }
      else {
        uVar1 = piVar4[lVar5];
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) goto LAB_005ec5a4;
        piVar6 = (int *)pVVar2->pArray[uVar1];
      }
      if (((piVar6[6] & 7U) != 2) || (*piVar6 < pAig->nTruePis)) {
        __assert_fail("Saig_ObjIsLo( pAig, pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                      ,0x11a,
                      "void Pdr_ManDeriveResult(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      piVar6[8] = pAig->nTravIds;
      lVar5 = lVar5 + 1;
    } while (iVar3 != lVar5);
  }
  vRes->nSize = 0;
  vPiLits->nSize = 0;
  if (0 < vCiObjs->nSize) {
    lVar5 = 0;
    do {
      pVVar2 = pAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        piVar4 = (int *)0x0;
      }
      else {
        uVar1 = vCiObjs->pArray[lVar5];
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
LAB_005ec5a4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar4 = (int *)pVVar2->pArray[uVar1];
      }
      if (((uint)*(undefined8 *)(piVar4 + 6) & 7) != 2) {
LAB_005ec5e2:
        __assert_fail("Saig_ObjIsLo(pAig, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                      ,0x128,
                      "void Pdr_ManDeriveResult(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (*piVar4 < pAig->nTruePis) {
        if (vCiVals->nSize <= lVar5) {
LAB_005ec601:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = *piVar4;
        p = vPiLits;
joined_r0x005ec54b:
        if (iVar3 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(p,(uint)(vCiVals->pArray[lVar5] == 0) + iVar3 * 2);
      }
      else {
        if (*piVar4 < pAig->nTruePis) goto LAB_005ec5e2;
        if (piVar4[8] != pAig->nTravIds) {
          if (vCiVals->nSize <= lVar5) goto LAB_005ec601;
          iVar3 = *piVar4 - pAig->nTruePis;
          p = vRes;
          goto joined_r0x005ec54b;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vCiObjs->nSize);
  }
  if (vRes->nSize == 0) {
    Vec_IntPush(vRes,0);
    return;
  }
  return;
}

Assistant:

void Pdr_ManDeriveResult( Aig_Man_t * pAig, Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vCi2Rem, Vec_Int_t * vRes, Vec_Int_t * vPiLits )
{
    Aig_Obj_t * pObj;
    int i, Lit;
    // mark removed flop outputs
    Aig_ManIncrementTravId( pAig );
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
    {
        assert( Saig_ObjIsLo( pAig, pObj ) );
        Aig_ObjSetTravIdCurrent(pAig, pObj);
    }
    // collect flop outputs that are not marked
    Vec_IntClear( vRes );
    Vec_IntClear( vPiLits );
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
    {
        if ( Saig_ObjIsPi(pAig, pObj) )
        {
            Lit = Abc_Var2Lit( Aig_ObjCioId(pObj), (Vec_IntEntry(vCiVals, i) == 0) );
            Vec_IntPush( vPiLits, Lit );
            continue;
        }
        assert( Saig_ObjIsLo(pAig, pObj) );
        if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
            continue;
        Lit = Abc_Var2Lit( Aig_ObjCioId(pObj) - Saig_ManPiNum(pAig), (Vec_IntEntry(vCiVals, i) == 0) );
        Vec_IntPush( vRes, Lit );
    }
    if ( Vec_IntSize(vRes) == 0 )
        Vec_IntPush(vRes, 0);
}